

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

Point __thiscall Point::randomPoint(Point *this,int max_x,int max_y)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Point PVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  do {
    iVar1 = rand();
    iVar2 = rand();
    auVar8._0_8_ = (double)(iVar1 % 1000000) + (double)(iVar1 % 1000000);
    auVar8._8_8_ = (double)(iVar2 % 1000000) + (double)(iVar2 % 1000000);
    auVar8 = divpd(auVar8,_DAT_001050c0);
    dVar7 = auVar8._0_8_ + -1.0;
    dVar9 = auVar8._8_8_ + -1.0;
    dVar3 = SQRT(dVar7 * dVar7 + dVar9 * dVar9);
  } while (1.0 < dVar3);
  dVar4 = log(dVar3);
  dVar4 = (dVar4 * -2.0) / dVar3;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar5 = log(dVar3);
  dVar3 = (dVar5 * -2.0) / dVar3;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar7 = ceil(dVar7 * dVar4 * (double)max_x);
  dVar3 = ceil(dVar9 * dVar3 * (double)max_y);
  PVar6.x = (int)dVar7;
  PVar6.y = (int)dVar3;
  *this = PVar6;
  return (Point)this;
}

Assistant:

Point Point::randomPoint(int max_x, int max_y){
	double v1 = 2*((double)(rand()%MAAAX))/MAAAX - 1;
	double v2 = 2*((double)(rand()%MAAAX))/	MAAAX - 1;
	double s = sqrt(v1*v1 + v2*v2);
	if (s > 1){
		return randomPoint(max_x, max_y);
	}
	double u1 = v1*sqrt(-2*log(s)/s);
	double u2 = v2*sqrt(-2*log(s)/s);
	u1 = u1;
	u2 = u2;
	int x = ceil(max_x*u1);
	int y = ceil(max_y*u2);
	return Point(x, y);
}